

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds_describe_drds_instance.cc
# Opt level: O1

int __thiscall
aliyun::Drds::DescribeDrdsInstance
          (Drds *this,DrdsDescribeDrdsInstanceRequestType *req,
          DrdsDescribeDrdsInstanceResponseType *response,DrdsErrorInfo *error_info)

{
  iterator *piVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  Int IVar5;
  ArrayIndex AVar6;
  char *pcVar7;
  AliRpcRequest *this_00;
  long *plVar8;
  size_t sVar9;
  Value *pVVar10;
  Value *pVVar11;
  size_type *psVar12;
  uint index;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  undefined1 local_380 [32];
  _Alloc_hider local_360;
  size_type local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  _Alloc_hider local_340;
  size_type local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  Value local_320;
  string local_308;
  Value *local_2e8;
  long *local_2e0;
  long local_2d8;
  long local_2d0 [2];
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  local_2c0._M_string_length = 0;
  local_2c0.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar7 = "https";
  }
  local_2e0 = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e0,pcVar7,pcVar7 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_380);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_320);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_2e0,local_2d8 + (long)local_2e0);
  std::__cxx11::string::append((char *)&local_140);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_2a0.field_2._M_allocated_capacity = *psVar12;
    local_2a0.field_2._8_8_ = plVar8[3];
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  }
  else {
    local_2a0.field_2._M_allocated_capacity = *psVar12;
    local_2a0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_2a0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar9 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar7,pcVar7 + sVar9);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_320,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"DescribeDrdsInstance","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->drds_instance_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"DrdsInstanceId","");
    pcVar2 = (req->drds_instance_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + (req->drds_instance_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_380);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_2c0);
    if (((0 < iVar4) && (local_2c0._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_2c0,&local_320,true), bVar3)) {
      if (error_info != (DrdsErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&local_320,"RequestId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_320,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_380,pVVar10);
        }
        else {
          local_380._0_8_ = local_380 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_380,anon_var_dwarf_179587 + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_380);
        pcVar2 = local_380 + 0x10;
        if ((pointer)local_380._0_8_ != pcVar2) {
          operator_delete((void *)local_380._0_8_,CONCAT71(local_380._17_7_,local_380[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_320,"Code");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_320,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_380,pVVar10);
        }
        else {
          local_380._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_380,anon_var_dwarf_179587 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_380);
        if ((pointer)local_380._0_8_ != pcVar2) {
          operator_delete((void *)local_380._0_8_,CONCAT71(local_380._17_7_,local_380[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_320,"HostId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_320,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_380,pVVar10);
        }
        else {
          local_380._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_380,anon_var_dwarf_179587 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_380);
        if ((pointer)local_380._0_8_ != pcVar2) {
          operator_delete((void *)local_380._0_8_,CONCAT71(local_380._17_7_,local_380[0x10]) + 1);
        }
        bVar3 = Json::Value::isMember(&local_320,"Message");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_320,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_380,pVVar10);
        }
        else {
          local_380._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_380,anon_var_dwarf_179587 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_380);
        if ((pointer)local_380._0_8_ != pcVar2) {
          operator_delete((void *)local_380._0_8_,CONCAT71(local_380._17_7_,local_380[0x10]) + 1);
        }
      }
      if (response != (DrdsDescribeDrdsInstanceResponseType *)0x0 && iVar4 == 200) {
        bVar3 = Json::Value::isMember(&local_320,"Success");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_320,"Success");
          bVar3 = Json::Value::asBool(pVVar10);
          response->success = bVar3;
        }
        bVar3 = Json::Value::isMember(&local_320,"Data");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&local_320,"Data");
          bVar3 = Json::Value::isMember(pVVar10,"DrdsInstanceId");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"DrdsInstanceId");
            Json::Value::asString_abi_cxx11_((string *)local_380,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->data).drds_instance_id,(string *)local_380);
            if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
              operator_delete((void *)local_380._0_8_,CONCAT71(local_380._17_7_,local_380[0x10]) + 1
                             );
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"Type");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"Type");
            Json::Value::asString_abi_cxx11_((string *)local_380,pVVar11);
            std::__cxx11::string::operator=((string *)&(response->data).type,(string *)local_380);
            if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
              operator_delete((void *)local_380._0_8_,CONCAT71(local_380._17_7_,local_380[0x10]) + 1
                             );
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"RegionId");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"RegionId");
            Json::Value::asString_abi_cxx11_((string *)local_380,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->data).region_id,(string *)local_380);
            if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
              operator_delete((void *)local_380._0_8_,CONCAT71(local_380._17_7_,local_380[0x10]) + 1
                             );
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"ZoneId");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"ZoneId");
            Json::Value::asString_abi_cxx11_((string *)local_380,pVVar11);
            std::__cxx11::string::operator=((string *)&(response->data).zone_id,(string *)local_380)
            ;
            if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
              operator_delete((void *)local_380._0_8_,CONCAT71(local_380._17_7_,local_380[0x10]) + 1
                             );
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"Description");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"Description");
            Json::Value::asString_abi_cxx11_((string *)local_380,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->data).description,(string *)local_380);
            if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
              operator_delete((void *)local_380._0_8_,CONCAT71(local_380._17_7_,local_380[0x10]) + 1
                             );
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"NetworkType");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"NetworkType");
            Json::Value::asString_abi_cxx11_((string *)local_380,pVVar11);
            std::__cxx11::string::operator=
                      ((string *)&(response->data).network_type,(string *)local_380);
            if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
              operator_delete((void *)local_380._0_8_,CONCAT71(local_380._17_7_,local_380[0x10]) + 1
                             );
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"Status");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"Status");
            Json::Value::asString_abi_cxx11_((string *)local_380,pVVar11);
            std::__cxx11::string::operator=((string *)&(response->data).status,(string *)local_380);
            if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
              operator_delete((void *)local_380._0_8_,CONCAT71(local_380._17_7_,local_380[0x10]) + 1
                             );
            }
          }
          bVar3 = Json::Value::isMember(pVVar10,"CreateTime");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"CreateTime");
            IVar5 = Json::Value::asInt(pVVar11);
            (response->data).create_time = (long)IVar5;
          }
          bVar3 = Json::Value::isMember(pVVar10,"Version");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"Version");
            IVar5 = Json::Value::asInt(pVVar11);
            (response->data).version = (long)IVar5;
          }
          bVar3 = Json::Value::isMember(pVVar10,"Vips");
          if (bVar3) {
            pVVar11 = Json::Value::operator[](pVVar10,"Vips");
            bVar3 = Json::Value::isMember(pVVar11,"Vip");
            if (bVar3) {
              pVVar10 = Json::Value::operator[](pVVar10,"Vips");
              pVVar10 = Json::Value::operator[](pVVar10,"Vip");
              bVar3 = Json::Value::isArray(pVVar10);
              if ((bVar3) && (AVar6 = Json::Value::size(pVVar10), AVar6 != 0)) {
                index = 0;
                local_2e8 = pVVar10;
                do {
                  local_380._8_8_ = 0;
                  local_380[0x10] = '\0';
                  local_360._M_p = (pointer)&local_350;
                  local_358 = 0;
                  local_350._M_local_buf[0] = '\0';
                  local_340._M_p = (pointer)&local_330;
                  local_338 = 0;
                  local_330._M_local_buf[0] = '\0';
                  local_380._0_8_ = local_380 + 0x10;
                  pVVar10 = Json::Value::operator[](local_2e8,index);
                  bVar3 = Json::Value::isMember(pVVar10,"IP");
                  if (bVar3) {
                    pVVar11 = Json::Value::operator[](pVVar10,"IP");
                    Json::Value::asString_abi_cxx11_(&local_308,pVVar11);
                    std::__cxx11::string::operator=((string *)local_380,(string *)&local_308);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_308._M_dataplus._M_p != &local_308.field_2) {
                      operator_delete(local_308._M_dataplus._M_p,
                                      local_308.field_2._M_allocated_capacity + 1);
                    }
                  }
                  bVar3 = Json::Value::isMember(pVVar10,"Port");
                  if (bVar3) {
                    pVVar11 = Json::Value::operator[](pVVar10,"Port");
                    Json::Value::asString_abi_cxx11_(&local_308,pVVar11);
                    std::__cxx11::string::operator=((string *)&local_360,(string *)&local_308);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_308._M_dataplus._M_p != &local_308.field_2) {
                      operator_delete(local_308._M_dataplus._M_p,
                                      local_308.field_2._M_allocated_capacity + 1);
                    }
                  }
                  bVar3 = Json::Value::isMember(pVVar10,"Type");
                  if (bVar3) {
                    pVVar10 = Json::Value::operator[](pVVar10,"Type");
                    Json::Value::asString_abi_cxx11_(&local_308,pVVar10);
                    std::__cxx11::string::operator=((string *)&local_340,(string *)&local_308);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_308._M_dataplus._M_p != &local_308.field_2) {
                      operator_delete(local_308._M_dataplus._M_p,
                                      local_308.field_2._M_allocated_capacity + 1);
                    }
                  }
                  std::
                  vector<aliyun::DrdsDescribeDrdsInstanceVipType,_std::allocator<aliyun::DrdsDescribeDrdsInstanceVipType>_>
                  ::push_back((vector<aliyun::DrdsDescribeDrdsInstanceVipType,_std::allocator<aliyun::DrdsDescribeDrdsInstanceVipType>_>
                               *)response,(value_type *)local_380);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_340._M_p != &local_330) {
                    operator_delete(local_340._M_p,
                                    CONCAT71(local_330._M_allocated_capacity._1_7_,
                                             local_330._M_local_buf[0]) + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_360._M_p != &local_350) {
                    operator_delete(local_360._M_p,
                                    CONCAT71(local_350._M_allocated_capacity._1_7_,
                                             local_350._M_local_buf[0]) + 1);
                  }
                  pVVar10 = local_2e8;
                  if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
                    operator_delete((void *)local_380._0_8_,
                                    CONCAT71(local_380._17_7_,local_380[0x10]) + 1);
                  }
                  AVar6 = Json::Value::size(pVVar10);
                  index = index + 1;
                } while (index < AVar6);
              }
            }
          }
        }
      }
      goto LAB_001320da;
    }
    if (error_info == (DrdsErrorInfo *)0x0) goto LAB_001320d5;
    pcVar7 = "parse response failed";
  }
  else {
    if (error_info == (DrdsErrorInfo *)0x0) {
LAB_001320d5:
      iVar4 = -1;
      goto LAB_001320da;
    }
    pcVar7 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar7);
LAB_001320da:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_320);
  if (local_2e0 != local_2d0) {
    operator_delete(local_2e0,local_2d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,
                    CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                             local_2c0.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Drds::DescribeDrdsInstance(const DrdsDescribeDrdsInstanceRequestType& req,
                      DrdsDescribeDrdsInstanceResponseType* response,
                       DrdsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeDrdsInstance");
  if(!req.drds_instance_id.empty()) {
    req_rpc->AddRequestQuery("DrdsInstanceId", req.drds_instance_id);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}